

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_msg.c
# Opt level: O0

void * add_location_option(pcp_flow_t *f,void *cur)

{
  uint16_t uVar1;
  pcp_location_option_t *location_op;
  void *cur_local;
  pcp_flow_t *f_local;
  
  *(undefined1 *)cur = 0x61;
  uVar1 = htons(0x20);
  *(uint16_t *)((long)cur + 2) = uVar1;
  *(undefined8 *)((long)cur + 4) = *(undefined8 *)(f->f_location).location;
  *(undefined8 *)((long)cur + 0xc) = *(undefined8 *)((f->f_location).location + 8);
  *(undefined8 *)((long)cur + 0x14) = *(undefined8 *)((f->f_location).location + 0x10);
  *(undefined8 *)((long)cur + 0x1c) = *(undefined8 *)((f->f_location).location + 0x18);
  return (void *)((long)cur + 0x24);
}

Assistant:

static void *add_location_option(pcp_flow_t *f, void *cur) {
    pcp_location_option_t *location_op = (pcp_location_option_t *)cur;

    location_op->option = PCP_OPTION_LOCATION;
    location_op->len =
        htons(sizeof(pcp_location_option_t) - sizeof(pcp_options_hdr_t));
    memcpy(&(location_op->location[0]), &(f->f_location.location[0]),
           MAX_GEO_STR);
    cur = location_op + 1;

    return cur;
}